

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testanimators.cpp
# Opt level: O0

int plus_or_minus_proc(Am_Object *self)

{
  Am_Value *value;
  Am_Input_Char local_24;
  Am_Input_Char ic;
  Am_Object inter;
  Am_Object *self_local;
  
  Am_Object::Get_Owner((Am_Object *)&stack0xffffffffffffffe0,(Am_Slot_Flags)self);
  value = (Am_Value *)Am_Object::Get((ushort)(Am_Object *)&stack0xffffffffffffffe0,0x11b);
  Am_Input_Char::Am_Input_Char(&local_24,value);
  if (local_24.code == 0x100) {
    self_local._4_4_ = -8;
  }
  else {
    self_local._4_4_ = 8;
  }
  Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffffe0);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, plus_or_minus)
{
  Am_Object inter = self.Get_Owner();
  //  Am_Input_Char ic = Am_Input_Char::Narrow(inter.GV(Am_START_CHAR));
  Am_Input_Char ic = inter.Get(Am_START_CHAR);
  if (ic.code == Am_LEFT_MOUSE)
    return -8;
  return 8;
}